

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

void Ppmd7_EncodeSymbol(CPpmd7 *p,CPpmd7z_RangeEnc *rc,int symbol)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  CPpmd_State *pCVar9;
  Byte BVar10;
  uint uVar11;
  uint uVar12;
  CPpmd_See *pCVar13;
  CPpmd_State *pCVar14;
  CPpmd_State *s1;
  UInt32 low;
  int cur;
  uint numMasked;
  uint i_1;
  UInt32 sum_1;
  CPpmd_State *s_2;
  CPpmd_See *see;
  UInt32 escFreq;
  uint j_1;
  CPpmd_State *s_1;
  UInt16 *prob;
  int local_138;
  uint j;
  uint i;
  UInt32 sum;
  CPpmd_State *s;
  size_t charMask [32];
  int symbol_local;
  CPpmd7z_RangeEnc *rc_local;
  CPpmd7 *p_local;
  
  if (p->MinContext->NumStats == 1) {
    bVar3 = *(byte *)((long)&p->MinContext->SummFreq + 1);
    bVar1 = p->NS2BSIndx[(int)(*(ushort *)(p->Base + p->MinContext->Suffix) - 1)];
    bVar2 = p->HB2Flag[p->FoundState->Symbol];
    p->HiBitsFlag = (uint)bVar2;
    s_1 = (CPpmd_State *)
          (p->BinSumm[(int)(bVar3 - 1)] +
          (p->PrevSuccess + (uint)bVar1 + (uint)bVar2 +
           (uint)p->HB2Flag[(byte)p->MinContext->SummFreq] * 2 + (p->RunLength >> 0x1a & 0x20U)));
    _escFreq = (CPpmd_State *)&p->MinContext->SummFreq;
    if ((uint)(byte)*(UInt16 *)_escFreq == symbol) {
      uVar4._0_1_ = s_1->Symbol;
      uVar4._1_1_ = s_1->Freq;
      RangeEnc_EncodeBit_0(rc,(uint)uVar4);
      uVar5._0_1_ = s_1->Symbol;
      uVar5._1_1_ = s_1->Freq;
      *(short *)s_1 = (*(short *)s_1 + 0x80) - (short)((int)(uVar5 + 0x20) >> 7);
      p->FoundState = _escFreq;
      Ppmd7_UpdateBin(p);
      return;
    }
    uVar6._0_1_ = s_1->Symbol;
    uVar6._1_1_ = s_1->Freq;
    RangeEnc_EncodeBit_1(rc,(uint)uVar6);
    uVar7._0_1_ = s_1->Symbol;
    uVar7._1_1_ = s_1->Freq;
    *(short *)s_1 = *(short *)s_1 - (short)((int)(uVar7 + 0x20) >> 7);
    uVar8._0_1_ = s_1->Symbol;
    uVar8._1_1_ = s_1->Freq;
    p->InitEsc = (uint)"\x19\x0e\t\a\x05\x05\x04\x04\x04\x03\x03\x03\x02\x02\x02\x02"
                       [(int)(uint)uVar8 >> 10];
    for (see._4_4_ = 0; see._4_4_ < 0x20; see._4_4_ = see._4_4_ + 8) {
      charMask[(ulong)see._4_4_ - 1] = 0xffffffffffffffff;
      charMask[(ulong)(see._4_4_ + 1) - 1] = 0xffffffffffffffff;
      charMask[(ulong)(see._4_4_ + 2) - 1] = 0xffffffffffffffff;
      charMask[(ulong)(see._4_4_ + 3) - 1] = 0xffffffffffffffff;
      charMask[(ulong)(see._4_4_ + 4) - 1] = 0xffffffffffffffff;
      charMask[(ulong)(see._4_4_ + 5) - 1] = 0xffffffffffffffff;
      charMask[(ulong)(see._4_4_ + 6) - 1] = 0xffffffffffffffff;
      charMask[(ulong)(see._4_4_ + 7) - 1] = 0xffffffffffffffff;
    }
    *(undefined1 *)((long)charMask + ((ulong)(byte)*(UInt16 *)_escFreq - 8)) = 0;
    p->PrevSuccess = 0;
  }
  else {
    _i = (CPpmd_State *)(p->Base + p->MinContext->Stats);
    if ((uint)_i->Symbol == symbol) {
      RangeEnc_Encode(rc,0,(uint)_i->Freq,(uint)p->MinContext->SummFreq);
      p->FoundState = _i;
      Ppmd7_Update1_0(p);
      return;
    }
    p->PrevSuccess = 0;
    j = (uint)_i->Freq;
    local_138 = p->MinContext->NumStats - 1;
    do {
      pCVar14 = _i + 1;
      if ((uint)_i[1].Symbol == symbol) {
        pCVar9 = _i + 1;
        _i = pCVar14;
        RangeEnc_Encode(rc,j,(uint)pCVar9->Freq,(uint)p->MinContext->SummFreq);
        p->FoundState = _i;
        Ppmd7_Update1(p);
        return;
      }
      j = _i[1].Freq + j;
      local_138 = local_138 + -1;
      _i = pCVar14;
    } while (local_138 != 0);
    p->HiBitsFlag = (uint)p->HB2Flag[p->FoundState->Symbol];
    for (prob._4_4_ = 0; prob._4_4_ < 0x20; prob._4_4_ = prob._4_4_ + 8) {
      charMask[(ulong)prob._4_4_ - 1] = 0xffffffffffffffff;
      charMask[(ulong)(prob._4_4_ + 1) - 1] = 0xffffffffffffffff;
      charMask[(ulong)(prob._4_4_ + 2) - 1] = 0xffffffffffffffff;
      charMask[(ulong)(prob._4_4_ + 3) - 1] = 0xffffffffffffffff;
      charMask[(ulong)(prob._4_4_ + 4) - 1] = 0xffffffffffffffff;
      charMask[(ulong)(prob._4_4_ + 5) - 1] = 0xffffffffffffffff;
      charMask[(ulong)(prob._4_4_ + 6) - 1] = 0xffffffffffffffff;
      charMask[(ulong)(prob._4_4_ + 7) - 1] = 0xffffffffffffffff;
    }
    *(undefined1 *)((long)charMask + ((ulong)pCVar14->Symbol - 8)) = 0;
    local_138 = p->MinContext->NumStats - 1;
    do {
      pCVar14 = _i + -1;
      *(undefined1 *)((long)charMask + ((ulong)_i[-1].Symbol - 8)) = 0;
      local_138 = local_138 + -1;
      _i = pCVar14;
    } while (local_138 != 0);
    RangeEnc_Encode(rc,j,p->MinContext->SummFreq - j,(uint)p->MinContext->SummFreq);
  }
  do {
    uVar11 = (uint)p->MinContext->NumStats;
    do {
      p->OrderFall = p->OrderFall + 1;
      if (p->MinContext->Suffix == 0) {
        return;
      }
      p->MinContext = (CPpmd7_Context *)(p->Base + p->MinContext->Suffix);
    } while (p->MinContext->NumStats == uVar11);
    pCVar13 = Ppmd7_MakeEscFreq(p,uVar11,(UInt32 *)&see);
    _i_1 = (CPpmd_State *)(p->Base + p->MinContext->Stats);
    numMasked = 0;
    cur = (int)p->MinContext->NumStats;
    do {
      pCVar14 = _i_1;
      uVar11 = numMasked;
      uVar12 = (uint)_i_1->Symbol;
      if (uVar12 == symbol) {
        do {
          numMasked = ((uint)_i_1->Freq & (int)*(char *)((long)charMask + ((ulong)_i_1->Symbol - 8))
                      ) + numMasked;
          _i_1 = _i_1 + 1;
          cur = cur + -1;
        } while (cur != 0);
        RangeEnc_Encode(rc,uVar11,(uint)pCVar14->Freq,numMasked + (UInt32)see);
        if ((pCVar13->Shift < 7) &&
           (BVar10 = pCVar13->Count + 0xff, pCVar13->Count = BVar10, BVar10 == '\0')) {
          pCVar13->Summ = pCVar13->Summ << 1;
          bVar3 = pCVar13->Shift;
          pCVar13->Shift = bVar3 + 1;
          pCVar13->Count = (Byte)(3 << (bVar3 & 0x1f));
        }
        p->FoundState = pCVar14;
        Ppmd7_Update2(p);
        return;
      }
      numMasked = ((uint)_i_1->Freq & (int)*(char *)((long)charMask + (long)(int)uVar12 + -8)) +
                  numMasked;
      *(undefined1 *)((long)charMask + (long)(int)uVar12 + -8) = 0;
      _i_1 = _i_1 + 1;
      cur = cur + -1;
    } while (cur != 0);
    RangeEnc_Encode(rc,numMasked,(UInt32)see,numMasked + (UInt32)see);
    pCVar13->Summ = pCVar13->Summ + (short)numMasked + (short)(UInt32)see;
  } while( true );
}

Assistant:

static void Ppmd7_EncodeSymbol(CPpmd7 *p, CPpmd7z_RangeEnc *rc, int symbol)
{
  size_t charMask[256 / sizeof(size_t)];
  if (p->MinContext->NumStats != 1)
  {
    CPpmd_State *s = Ppmd7_GetStats(p, p->MinContext);
    UInt32 sum;
    unsigned i;
    if (s->Symbol == symbol)
    {
      RangeEnc_Encode(rc, 0, s->Freq, p->MinContext->SummFreq);
      p->FoundState = s;
      Ppmd7_Update1_0(p);
      return;
    }
    p->PrevSuccess = 0;
    sum = s->Freq;
    i = p->MinContext->NumStats - 1;
    do
    {
      if ((++s)->Symbol == symbol)
      {
        RangeEnc_Encode(rc, sum, s->Freq, p->MinContext->SummFreq);
        p->FoundState = s;
        Ppmd7_Update1(p);
        return;
      }
      sum += s->Freq;
    }
    while (--i);
    
    p->HiBitsFlag = p->HB2Flag[p->FoundState->Symbol];
    PPMD_SetAllBitsIn256Bytes(charMask);
    MASK(s->Symbol) = 0;
    i = p->MinContext->NumStats - 1;
    do { MASK((--s)->Symbol) = 0; } while (--i);
    RangeEnc_Encode(rc, sum, p->MinContext->SummFreq - sum, p->MinContext->SummFreq);
  }
  else
  {
    UInt16 *prob = Ppmd7_GetBinSumm(p);
    CPpmd_State *s = Ppmd7Context_OneState(p->MinContext);
    if (s->Symbol == symbol)
    {
      RangeEnc_EncodeBit_0(rc, *prob);
      *prob = (UInt16)PPMD_UPDATE_PROB_0(*prob);
      p->FoundState = s;
      Ppmd7_UpdateBin(p);
      return;
    }
    else
    {
      RangeEnc_EncodeBit_1(rc, *prob);
      *prob = (UInt16)PPMD_UPDATE_PROB_1(*prob);
      p->InitEsc = PPMD7_kExpEscape[*prob >> 10];
      PPMD_SetAllBitsIn256Bytes(charMask);
      MASK(s->Symbol) = 0;
      p->PrevSuccess = 0;
    }
  }
  for (;;)
  {
    UInt32 escFreq;
    CPpmd_See *see;
    CPpmd_State *s;
    UInt32 sum;
    unsigned i, numMasked = p->MinContext->NumStats;
    do
    {
      p->OrderFall++;
      if (!p->MinContext->Suffix)
        return; /* EndMarker (symbol = -1) */
      p->MinContext = Ppmd7_GetContext(p, p->MinContext->Suffix);
    }
    while (p->MinContext->NumStats == numMasked);
    
    see = Ppmd7_MakeEscFreq(p, numMasked, &escFreq);
    s = Ppmd7_GetStats(p, p->MinContext);
    sum = 0;
    i = p->MinContext->NumStats;
    do
    {
      int cur = s->Symbol;
      if (cur == symbol)
      {
        UInt32 low = sum;
        CPpmd_State *s1 = s;
        do
        {
          sum += (s->Freq & (int)(MASK(s->Symbol)));
          s++;
        }
        while (--i);
        RangeEnc_Encode(rc, low, s1->Freq, sum + escFreq);
        Ppmd_See_Update(see);
        p->FoundState = s1;
        Ppmd7_Update2(p);
        return;
      }
      sum += (s->Freq & (int)(MASK(cur)));
      MASK(cur) = 0;
      s++;
    }
    while (--i);
    
    RangeEnc_Encode(rc, sum, escFreq, sum + escFreq);
    see->Summ = (UInt16)(see->Summ + sum + escFreq);
  }
}